

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_derive.c
# Opt level: O0

int test_derive_alg(char *algo,char *param,int mode)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 in_EDX;
  char *in_RSI;
  char *in_RDI;
  uchar *skeyB;
  uchar *skeyA;
  size_t skeyB_len;
  size_t skeyA_len;
  EVP_PKEY *keyB;
  EVP_PKEY *keyA;
  int ukm_len;
  int dgst_nid;
  char *name;
  int ret;
  size_t local_50;
  size_t local_48;
  EVP_PKEY *local_40;
  EVP_PKEY *local_38;
  int local_30;
  int local_2c;
  char *local_28;
  int local_20;
  char *local_18;
  char *local_10;
  
  local_20 = 0;
  local_28 = (char *)0x0;
  local_2c = 0;
  local_30 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  switch(in_EDX) {
  case 0:
    local_2c = 0x3d6;
    local_28 = "VKO256";
    local_30 = 1;
    break;
  case 1:
    local_2c = 0x3d7;
    local_28 = "VKO512";
    local_30 = 1;
    break;
  case 2:
    local_28 = "VKO";
    local_30 = 8;
    break;
  case 3:
    iVar1 = strcmp(in_RDI,"gost2001");
    if (iVar1 == 0) {
      return 0;
    }
    local_28 = "KEG";
    local_30 = 0x20;
    break;
  default:
    abort();
  }
  printf("\x1b[1;34mTest %s for %s %s\x1b[m - ",local_28,local_10,local_18);
  iVar1 = keygen(local_10,local_18);
  local_38 = (EVP_PKEY *)CONCAT44(extraout_var,iVar1);
  iVar1 = keygen(local_10,local_18);
  local_40 = (EVP_PKEY *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = derive((EVP_PKEY *)local_38,(EVP_PKEY *)local_40,local_2c,local_30,&local_48);
  iVar2 = derive((EVP_PKEY *)local_40,(EVP_PKEY *)local_38,local_2c,local_30,&local_50);
  local_20 = memcmp((void *)CONCAT44(extraout_var_01,iVar1),(void *)CONCAT44(extraout_var_02,iVar2),
                    local_48);
  if (local_20 == 0) {
    printf("\x1b[1;32mKEK match\x1b[m\n");
  }
  else {
    printf("\x1b[1;31mKEK mismatch\x1b[m\n");
  }
  EVP_PKEY_free(local_38);
  EVP_PKEY_free(local_40);
  CRYPTO_free((void *)CONCAT44(extraout_var_01,iVar1));
  CRYPTO_free((void *)CONCAT44(extraout_var_02,iVar2));
  return local_20;
}

Assistant:

int test_derive_alg(const char *algo, const char *param, int mode)
{
    int ret = 0;

    char *name = NULL;
    int dgst_nid = 0;
    int ukm_len = 0;
    switch (mode) {
    case 0:
        dgst_nid = NID_id_GostR3411_2012_256;
        name = "VKO256";
        ukm_len = 1;
        break;
    case 1:
        dgst_nid = NID_id_GostR3411_2012_512;
        name = "VKO512";
        ukm_len = 1;
        break;
    case 2:
        name = "VKO";
        ukm_len = 8;
        break;
    case 3:
        if (!strcmp(algo, "gost2001"))
            return 0; /* Skip. */
        name = "KEG";
        ukm_len = 32;
        break;
#define NR_MODES 4
    default:
        abort();
    }
    printf(cBLUE "Test %s for %s %s" cNORM " - ", name, algo, param);

    EVP_PKEY *keyA = keygen(algo, param);
    EVP_PKEY *keyB = keygen(algo, param);

    size_t skeyA_len, skeyB_len;
    unsigned char *skeyA = derive(keyA, keyB, dgst_nid, ukm_len, &skeyA_len);
    unsigned char *skeyB = derive(keyB, keyA, dgst_nid, ukm_len, &skeyB_len);

    ret = memcmp(skeyA, skeyB, skeyA_len);
    if (!ret)
        printf(cGREEN "KEK match" cNORM "\n");
    else
        printf(cRED "KEK mismatch" cNORM "\n");

    EVP_PKEY_free(keyA);
    EVP_PKEY_free(keyB);
    OPENSSL_free(skeyA);
    OPENSSL_free(skeyB);
    return ret;
}